

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O3

bool __thiscall
ArmParser::parseArmParameters
          (ArmParser *this,Parser *parser,tArmOpcode *opcode,ArmOpcodeVariables *vars)

{
  char symbol;
  uint uVar1;
  char cVar2;
  bool bVar3;
  byte bVar4;
  Token *pTVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ArmParser *this_00;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  ArmRegisterValue tempRegister;
  
  pcVar9 = opcode->mask;
  (vars->Shift).UseShift = false;
  (vars->Shift).UseFinal = false;
  vars->psr = false;
  vars->writeback = false;
  vars->SignPlus = false;
  (vars->Opcode).UseNewEncoding = false;
  (vars->Opcode).UseNewType = false;
  cVar2 = *pcVar9;
  if (cVar2 != '\0') {
    this_00 = this;
    do {
      uVar8 = (ulong)(cVar2 == '/');
      pcVar10 = pcVar9 + uVar8 + 1;
      symbol = pcVar9[uVar8];
      switch(symbol) {
      case 'D':
        bVar3 = parseRegisterTable(this_00,parser,&(vars->CopData).cd,armCopRegisters,0x10);
        break;
      case 'E':
      case 'F':
      case 'G':
      case 'H':
      case 'J':
      case 'K':
      case 'L':
      case 'O':
      case 'Q':
      case 'T':
      case 'U':
      case 'V':
        goto switchD_00161166_caseD_45;
      case 'I':
switchD_00161166_caseD_49:
        this_00 = this;
        bVar3 = parseImmediate(this,parser,&vars->ImmediateExpression);
        iVar7 = 0x20;
        goto LAB_001612ff;
      case 'M':
        bVar3 = parseRegisterTable(this_00,parser,&(vars->CopData).cm,armCopRegisters,0x10);
        break;
      case 'N':
        bVar3 = parseRegisterTable(this_00,parser,&(vars->CopData).cn,armCopRegisters,0x10);
        break;
      case 'P':
        bVar4 = parsePsrTransfer(this_00,parser,vars,*pcVar10 == '1');
        goto joined_r0x0016141d;
      case 'R':
        bVar3 = parseRegisterList(this_00,parser,&vars->rlist,0xffff);
        break;
      case 'S':
        this_00 = this;
        bVar4 = parseShift(this,parser,vars,*pcVar10 == '1');
        goto joined_r0x0016141d;
      case 'W':
        parseWriteback(this_00,parser,&vars->writeback);
        goto LAB_00161426;
      case 'X':
        bVar3 = parseRegisterTable(this_00,parser,&(vars->CopData).pn,armCopNumbers,0x10);
        break;
      case 'Y':
        this_00 = this;
        bVar3 = parseImmediate(this,parser,&(vars->CopData).CpopExpression);
        iVar7 = 4;
        goto LAB_001612ff;
      case 'Z':
        this_00 = this;
        bVar3 = parseImmediate(this,parser,&(vars->CopData).CpinfExpression);
        iVar7 = 3;
LAB_001612ff:
        if (bVar3 == false) {
          return false;
        }
LAB_00161307:
        vars->ImmediateBitLen = iVar7;
        goto LAB_00161426;
      default:
        switch(symbol) {
        case 'i':
          goto switchD_00161166_caseD_49;
        case 'j':
          this_00 = this;
          bVar3 = parseImmediate(this,parser,&vars->ImmediateExpression);
          if (!bVar3) {
            return false;
          }
          iVar7 = (int)pcVar9[uVar8 + 1];
          pcVar10 = pcVar9 + uVar8 + 2;
          goto LAB_00161307;
        case 'k':
        case 'l':
        case 'o':
        case 'q':
        case 'r':
        case 't':
        case 'u':
        case 'w':
        case 'x':
        case 'y':
          goto switchD_00161166_caseD_45;
        case 'm':
          cVar2 = *pcVar10;
          bVar3 = parseRegisterTable(this_00,parser,&vars->rm,armRegisters,0x13);
          uVar6 = cVar2 == '1' ^ 0xf;
          uVar1 = (vars->rm).num;
          bVar13 = SBORROW4(uVar1,uVar6);
          bVar12 = (int)(uVar1 - uVar6) < 0;
          bVar11 = uVar1 == uVar6;
          break;
        case 'n':
          cVar2 = *pcVar10;
          bVar3 = parseRegisterTable(this_00,parser,&vars->rn,armRegisters,0x13);
          uVar6 = cVar2 == '1' ^ 0xf;
          uVar1 = (vars->rn).num;
          bVar13 = SBORROW4(uVar1,uVar6);
          bVar12 = (int)(uVar1 - uVar6) < 0;
          bVar11 = uVar1 == uVar6;
          break;
        case 'p':
          parsePsr(this_00,parser,&vars->psr);
          goto LAB_00161426;
        case 's':
          cVar2 = *pcVar10;
          bVar3 = parseRegisterTable(this_00,parser,&vars->rs,armRegisters,0x13);
          uVar6 = cVar2 == '1' ^ 0xf;
          uVar1 = (vars->rs).num;
          bVar13 = SBORROW4(uVar1,uVar6);
          bVar12 = (int)(uVar1 - uVar6) < 0;
          bVar11 = uVar1 == uVar6;
          break;
        case 'v':
          parseSign(this_00,parser,&vars->SignPlus);
          goto LAB_00161426;
        case 'z':
          this_00 = this;
          bVar4 = parsePseudoShift(this,parser,vars,(int)*pcVar10);
          goto joined_r0x0016141d;
        default:
          if (symbol == 'd') {
            cVar2 = *pcVar10;
            bVar3 = parseRegisterTable(this_00,parser,&vars->rd,armRegisters,0x13);
            uVar6 = cVar2 == '1' ^ 0xf;
            uVar1 = (vars->rd).num;
            bVar13 = SBORROW4(uVar1,uVar6);
            bVar12 = (int)(uVar1 - uVar6) < 0;
            bVar11 = uVar1 == uVar6;
            break;
          }
          goto switchD_00161166_caseD_45;
        }
        bVar4 = bVar3 & (bVar11 || bVar13 != bVar12);
joined_r0x0016141d:
        if (bVar4 == 0) {
          return false;
        }
        pcVar10 = pcVar9 + uVar8 + 2;
        goto LAB_00161426;
      }
LAB_001612c2:
      if (bVar3 == false) {
        return false;
      }
LAB_00161426:
      cVar2 = *pcVar10;
      pcVar9 = pcVar10;
    } while (cVar2 != '\0');
  }
  pTVar5 = Tokenizer::nextToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
  return pTVar5->type == Separator;
switchD_00161166_caseD_45:
  bVar3 = matchSymbol(this_00,parser,symbol,cVar2 == '/');
  goto LAB_001612c2;
}

Assistant:

bool ArmParser::parseArmParameters(Parser& parser, const tArmOpcode& opcode, ArmOpcodeVariables& vars)
{
	const char* encoding = opcode.mask;

	ArmRegisterValue tempRegister;
	
	vars.Shift.UseShift = false;
	vars.Shift.UseFinal = false;
	vars.psr = false;
	vars.writeback = false;
	vars.SignPlus = false;
	vars.Opcode.UseNewEncoding = false;
	vars.Opcode.UseNewType = false;

	while (*encoding != 0)
	{
		bool optional = *encoding == '/';
		if (optional)
			encoding++;

		switch (*encoding++)
		{
		case 'd': // register
			CHECK(parseRegister(parser,vars.rd,*encoding++ == '1' ? 14 : 15));
			break;
		case 's': // register
			CHECK(parseRegister(parser,vars.rs,*encoding++ == '1' ? 14 : 15));
			break;
		case 'n': // register
			CHECK(parseRegister(parser,vars.rn,*encoding++ == '1' ? 14 : 15));
			break;
		case 'm': // register
			CHECK(parseRegister(parser,vars.rm,*encoding++ == '1' ? 14 : 15));
			break;
		case 'D': // cop register
			CHECK(parseCopRegister(parser,vars.CopData.cd));
			break;
		case 'N': // cop register
			CHECK(parseCopRegister(parser,vars.CopData.cn));
			break;
		case 'M': // cop register
			CHECK(parseCopRegister(parser,vars.CopData.cm));
			break;
		case 'W':	// writeback
			parseWriteback(parser,vars.writeback);
			break;
		case 'p':	// psr
			parsePsr(parser,vars.psr);
			break;
		case 'P':	// msr/mrs psr data
			CHECK(parsePsrTransfer(parser,vars,*encoding++ == '1'));
			break;
		case 'R':	// register list
			CHECK(parseRegisterList(parser,vars.rlist,0xFFFF));
			break;
		case 'S':	// shift
			CHECK(parseShift(parser,vars,*encoding++ == '1'));
			break;
		case 'I':	// immediate
		case 'i':
			CHECK(parseImmediate(parser,vars.ImmediateExpression));
			vars.ImmediateBitLen = 32;
			break;
		case 'j':	// variable bit immediate
			CHECK(parseImmediate(parser,vars.ImmediateExpression));
			vars.ImmediateBitLen = *encoding++;
			break;
		case 'X': // cop number
			CHECK(parseCopNumber(parser,vars.CopData.pn));
			break;
		case 'Y':	// cop opcode number
			CHECK(parseImmediate(parser,vars.CopData.CpopExpression));
			vars.ImmediateBitLen = 4;
			break;
		case 'Z':	// cop info number
			CHECK(parseImmediate(parser,vars.CopData.CpinfExpression));
			vars.ImmediateBitLen = 3;
			break;
		case 'z':	// shift for pseudo opcodes
			CHECK(parsePseudoShift(parser,vars,*encoding++));
			break;
		case 'v':	// sign for register index parameter
			parseSign(parser,vars.SignPlus);
			break;
		default:
			CHECK(matchSymbol(parser,*(encoding-1),optional));
			break;
		}
	}

	// the next token has to be a separator, else the parameters aren't
	// completely parsed
	return parser.nextToken().type == TokenType::Separator;
}